

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
          (QPodArrayOps<QPointF> *this,qsizetype i,QPointF *args)

{
  QPointF **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  qreal qVar5;
  qreal qVar6;
  QPointF *pQVar7;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QPointF>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0012b9ed:
    qVar5 = args->xp;
    qVar6 = args->yp;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QPointF>).size != 0);
    QArrayDataPointer<QPointF>::detachAndGrow
              (&this->super_QArrayDataPointer<QPointF>,where,1,(QPointF **)0x0,
               (QArrayDataPointer<QPointF> *)0x0);
    pQVar7 = createHole(this,where,i,1);
    pQVar7->xp = qVar5;
    pQVar7->yp = qVar6;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QPointF>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<QPointF>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) +
        lVar4)) {
      qVar5 = args->yp;
      pQVar7 = (this->super_QArrayDataPointer<QPointF>).ptr + lVar4;
      pQVar7->xp = args->xp;
      pQVar7->yp = qVar5;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QPointF *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QPointF>).ptr)) goto LAB_0012b9ed;
      pQVar7 = (this->super_QArrayDataPointer<QPointF>).ptr;
      qVar5 = args->yp;
      pQVar7[-1].xp = args->xp;
      pQVar7[-1].yp = qVar5;
      ppQVar1 = &(this->super_QArrayDataPointer<QPointF>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QPointF>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }